

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

dirent * ixxx::posix::readdir(DIR *__dirp)

{
  int *piVar1;
  dirent *pdVar2;
  readdir_error *this;
  dirent *r;
  DIR *dirp_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  pdVar2 = ::readdir(__dirp);
  piVar1 = __errno_location();
  if (*piVar1 != 0) {
    this = (readdir_error *)__cxa_allocate_exception(0x20);
    piVar1 = __errno_location();
    readdir_error::sys_error(this,*piVar1,(char *)0x0,ERRNO);
    __cxa_throw(this,&readdir_error::typeinfo,readdir_error::~readdir_error);
  }
  return pdVar2;
}

Assistant:

struct dirent *readdir(DIR *dirp)
    {
      errno = 0;
      struct dirent *r = ::readdir(dirp);
      if (errno)
        throw readdir_error(errno);
      return r;
    }